

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc_priv.h
# Opt level: O0

void hooked_regions_add(hook *h,uint64_t start,uint64_t length)

{
  gpointer pvVar1;
  uint64_t *key;
  HookedRegion *r;
  HookedRegion tmp;
  uint64_t length_local;
  uint64_t start_local;
  hook *h_local;
  
  r = (HookedRegion *)start;
  tmp.start = length;
  tmp.length = length;
  pvVar1 = g_hash_table_lookup(h->hooked_regions,&r);
  if (pvVar1 == (gpointer)0x0) {
    key = (uint64_t *)malloc(0x10);
    *key = start;
    key[1] = tmp.length;
    g_hash_table_insert(h->hooked_regions,key,&DAT_00000001);
  }
  return;
}

Assistant:

static inline void hooked_regions_add(struct hook *h, uint64_t start,
                                      uint64_t length)
{
    HookedRegion tmp;
    tmp.start = start;
    tmp.length = length;

    if (!g_hash_table_lookup(h->hooked_regions, (void *)&tmp)) {
        HookedRegion *r = malloc(sizeof(HookedRegion));
        r->start = start;
        r->length = length;
        g_hash_table_insert(h->hooked_regions, (void *)r, (void *)1);
    }
}